

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall soplex::SSVectorBase<double>::setup(SSVectorBase<double> *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  SSVectorBase<double> *in_RDI;
  SSVectorBase<double> *this_00;
  double dVar4;
  int i;
  int d;
  int local_10;
  
  bVar1 = isSetup(in_RDI);
  if (!bVar1) {
    IdxSet::clear(&in_RDI->super_IdxSet);
    iVar2 = dim((SSVectorBase<double> *)0x27b9b4);
    (in_RDI->super_IdxSet).num = 0;
    for (local_10 = 0; local_10 < iVar2; local_10 = local_10 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,(long)local_10);
      if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)local_10);
        this_00 = (SSVectorBase<double> *)spxAbs<double>(*pvVar3);
        dVar4 = getEpsilon(this_00);
        if (dVar4 < (double)this_00) {
          (in_RDI->super_IdxSet).idx[(in_RDI->super_IdxSet).num] = local_10;
          (in_RDI->super_IdxSet).num = (in_RDI->super_IdxSet).num + 1;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(in_RDI->super_VectorBase<double>).val,(long)local_10);
          *pvVar3 = 0.0;
        }
      }
    }
    in_RDI->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }